

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O3

Validity * __thiscall
capnp::compiler::CompilerMain::evalConst
          (Validity *__return_storage_ptr__,CompilerMain *this,StringPtr name)

{
  RawSchema *pRVar1;
  Reader brand;
  undefined1 auVar2 [40];
  Reader reader;
  Field field;
  PointerReader reader_00;
  Reader value_00;
  Reader value_01;
  StringPtr name_00;
  Tuple<kj::String,_kj::Array<unsigned_long>_> *pTVar3;
  size_t sVar4;
  StructSchema SVar5;
  SegmentReader *pSVar6;
  Format FVar7;
  int iVar8;
  ConstSchema constant;
  RawBrandedSchema *pRVar9;
  Arena *pAVar10;
  Reader *extraout_RDX;
  Reader *extraout_RDX_00;
  Reader *extraout_RDX_01;
  Reader *extraout_RDX_02;
  Reader *params;
  Reader *extraout_RDX_03;
  long extraout_RDX_04;
  long extraout_RDX_05;
  ProcessContext *pPVar11;
  long lVar12;
  Schema SVar13;
  char *pcVar14;
  RawBrandedSchema *pRVar15;
  undefined8 uVar16;
  bool bVar17;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_00;
  StringPtr SVar18;
  ReaderOptions options;
  ReaderFor<capnp::DynamicStruct> structValue_1;
  Schema schema;
  StringPtr partName;
  ReaderFor<capnp::DynamicList> listValue;
  Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> nameParts;
  Reader value;
  ReaderFor<capnp::DynamicStruct> structValue;
  IteratorInput<char,_const_char_*> input;
  word zeroWord [1];
  ArrayPtr<const_capnp::word> segments [1];
  SegmentArrayMessageReader emptyMessage;
  Fault f;
  undefined8 params_4;
  Schema local_408;
  undefined8 in_stack_fffffffffffffc00;
  undefined8 in_stack_fffffffffffffc08;
  undefined8 in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc18;
  undefined4 in_stack_fffffffffffffc1c;
  undefined8 in_stack_fffffffffffffc20;
  undefined8 in_stack_fffffffffffffc28;
  undefined8 in_stack_fffffffffffffc30;
  undefined8 in_stack_fffffffffffffc38;
  Schema local_3c0;
  SegmentReader *local_3b8;
  ArrayDisposer *local_3b0;
  Arena *local_3a8;
  size_t local_3a0;
  ReaderFor<DynamicList> local_398;
  Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> local_348;
  Reader local_330;
  ReaderFor<DynamicStruct> local_2e8;
  Validity *local_2b0;
  IteratorInput<char,_const_char_*> local_2a8;
  StructSchema local_288;
  RawBrandedSchema *local_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 uStack_230;
  word local_208;
  ReaderFor<DynamicStruct> local_200;
  ReaderFor<DynamicList> local_1c8;
  ArrayPtr<const_capnp::word> local_188;
  SegmentArrayMessageReader local_178;
  Sequence_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::IdentifierToString>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__[_>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,__]_>_>,_false>,_kj::parse::OneOf_<const_kj::parse::EndOfInput__&,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::NotLookingAt_<const_kj::parse::EndOfInput__&>_>_>_>,_false>,_const_kj::parse::EndOfInput__&>
  local_90;
  char (*params_2) [19];
  
  local_2a8.pos = name.content.ptr;
  if (this->flat == true) {
    FVar7 = this->packed | FLAT;
  }
  else {
    FVar7 = PACKED;
    if (this->packed == false) {
      FVar7 = BINARY;
      if (this->binary == false) {
        FVar7 = this->convertTo;
      }
    }
  }
  this->convertTo = FVar7;
  if ((long)(this->sourceFiles).builder.pos - (long)(this->sourceFiles).builder.ptr != 0x20) {
    local_90.first.subParser.first =
         (Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::IdentifierToString>
          *)0x0;
    local_178.super_MessageReader._vptr_MessageReader = (_func_int **)0x0;
    local_178.super_MessageReader.options.traversalLimitInWords = 0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_90,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/capnp.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_90);
  }
  local_90.first.subParser.first =
       (Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::IdentifierToString>
        *)kj::parse::identifier;
  local_90.first.subParser.rest.first.subParser.rest.first =
       (Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>
        *)kj::parse::integer;
  local_90.first.subParser.rest.rest.first.first = (EndOfInput_ *)&kj::parse::endOfInput;
  local_90.first.subParser.rest.rest.first.rest.first.rest.first.subParser =
       (EndOfInput_ *)&kj::parse::endOfInput;
  local_90.rest.first = (EndOfInput_ *)&kj::parse::endOfInput;
  local_2a8.end = local_2a8.pos + (name.content.size_ - 1);
  local_2a8.parent = (IteratorInput<char,_const_char_*> *)0x0;
  local_348.disposer = (ArrayDisposer *)0x0;
  local_348.ptr = (Tuple<kj::String,_kj::Array<unsigned_long>_> *)0x0;
  local_348.size_ = 0;
  local_2a8.best = local_2a8.pos;
  kj::parse::
  Sequence_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::IdentifierToString>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'['>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'0'>,_kj::parse::ExactlyConst_<char,_'x'>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'0'>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,_']'>_>,_false>,_kj::parse::OneOf_<const_kj::parse::EndOfInput__&,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'.'>,_kj::parse::NotLookingAt_<const_kj::parse::EndOfInput__&>_>_>_>,_false>,_const_kj::parse::EndOfInput__&>
  ::parseNext<kj::parse::IteratorInput<char,_const_char_*>_>
            ((Maybe<kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>_> *)&local_330,
             &local_90,&local_2a8);
  local_178.super_MessageReader._vptr_MessageReader =
       (_func_int **)
       CONCAT71(local_178.super_MessageReader._vptr_MessageReader._1_7_,(undefined1)local_330.type);
  if ((undefined1)local_330.type == UNKNOWN) {
    kj::heapString((String *)&local_330,"invalid syntax",0xe);
    (__return_storage_ptr__->errorMessage).ptr.isSet = true;
    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.ptr =
         (char *)CONCAT44(local_330._4_4_,local_330.type);
    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.size_ =
         local_330.field_1.intValue;
    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.disposer =
         (ArrayDisposer *)local_330.field_1.textValue.super_StringPtr.content.size_;
    goto LAB_0019de2f;
  }
  local_348.ptr = (Tuple<kj::String,_kj::Array<unsigned_long>_> *)local_330.field_1.intValue;
  local_348.size_ = local_330.field_1.textValue.super_StringPtr.content.size_;
  local_348.disposer = (ArrayDisposer *)local_330.field_1.listValue.reader.segment;
  pcVar14 = (char *)((this->sourceFiles).builder.ptr)->id;
  local_3b8 = (SegmentReader *)local_330.field_1.intValue;
  local_3b0 = (ArrayDisposer *)local_330.field_1.textValue.super_StringPtr.content.size_;
  uVar16 = local_330.field_1.intValue;
  local_2b0 = __return_storage_ptr__;
  if (local_330.field_1._8_8_ == (ArrayDisposer *)0x0) {
LAB_0019d7a0:
    local_178.super_MessageReader.options.traversalLimitInWords = (uint64_t)pcVar14;
    bVar17 = false;
  }
  else {
    lVar12 = local_330.field_1.textValue.super_StringPtr.content.size_ * 0x30;
    do {
      pAVar10 = (Arena *)0x2781dd;
      if (*(long *)&((SegmentReader *)uVar16)->id != 0) {
        pAVar10 = ((SegmentReader *)uVar16)->arena;
      }
      SVar18.content.size_ = (size_t)pAVar10;
      SVar18.content.ptr = pcVar14;
      Compiler::lookup((Compiler *)&local_178,(uint64_t)(this->compiler).ptr,SVar18);
      if ((char)local_178.super_MessageReader._vptr_MessageReader != '\x01') goto LAB_0019d7a0;
      bVar17 = ((SegmentReader *)uVar16)->readLimiter != (ReadLimiter *)0x0;
      if (bVar17) break;
      uVar16 = &((SegmentReader *)(uVar16 + 0x28))->id;
      lVar12 = lVar12 + -0x30;
      pcVar14 = (char *)local_178.super_MessageReader.options.traversalLimitInWords;
    } while (lVar12 != 0);
  }
  local_258 = 0;
  local_268 = 0;
  uStack_260 = 0;
  local_278 = 0;
  uStack_270 = 0;
  uStack_250 = 0x7fffffff;
  SVar13.raw = (RawBrandedSchema *)0x0;
  auVar2 = ZEXT1640(ZEXT816(0));
  brand._reader._40_8_ = 0x7fffffff;
  brand._reader.segment = (SegmentReader *)auVar2._0_8_;
  brand._reader.capTable = (CapTableReader *)auVar2._8_8_;
  brand._reader.data = (void *)auVar2._16_8_;
  brand._reader.pointers = (WirePointer *)auVar2._24_8_;
  brand._reader.dataSize = auVar2._32_4_;
  brand._reader.pointerCount = auVar2._36_2_;
  brand._reader._38_2_ = auVar2._38_2_;
  local_3c0 = SchemaLoader::get(&((this->compiler).ptr)->loader,
                                local_178.super_MessageReader.options.traversalLimitInWords,brand,
                                (Schema)0x2c07a8);
  __return_storage_ptr__ = local_2b0;
  local_330.type = UNKNOWN;
  local_188.ptr = &local_208;
  local_208.content = 0;
  local_188.size_ = 1;
  segments_00.size_ = 1;
  segments_00.ptr = &local_188;
  options._8_8_ = 0x40;
  options.traversalLimitInWords = 0x800000;
  params_2 = (char (*) [19])0x40;
  SegmentArrayMessageReader::SegmentArrayMessageReader(&local_178,segments_00,options);
  Schema::getProto((Reader *)&local_408,&local_3c0);
  if ((uint)in_stack_fffffffffffffc18 < 0x70) {
LAB_0019d8d6:
    if (bVar17) {
      SVar18 = Schema::getShortDisplayName(&local_3c0);
      local_398.schema.elementType._0_7_ = SVar18.content.ptr._0_7_;
      local_398.schema.elementType._7_1_ = SVar18.content.ptr._7_1_;
      local_398.schema.elementType.field_4.scopeId._0_7_ = SVar18.content.size_._0_7_;
      local_398.schema.elementType.field_4.scopeId._7_1_ = SVar18.content.size_._7_1_;
      kj::str<char_const(&)[2],kj::StringPtr,char_const(&)[17]>
                ((String *)&local_408,(kj *)0x26506b,(char (*) [2])&local_398,(StringPtr *)0x254b55,
                 (char (*) [17])&local_398);
    }
    else if ((SegmentReader *)uVar16 == (SegmentReader *)((long)local_3b8 + (long)local_3b0 * 0x30))
    {
      SVar18 = Schema::getShortDisplayName(&local_3c0);
      local_398.schema.elementType._0_7_ = SVar18.content.ptr._0_7_;
      local_398.schema.elementType._7_1_ = SVar18.content.ptr._7_1_;
      local_398.schema.elementType.field_4.scopeId._0_7_ = SVar18.content.size_._0_7_;
      local_398.schema.elementType.field_4.scopeId._7_1_ = SVar18.content.size_._7_1_;
      kj::str<char_const(&)[2],kj::StringPtr,char_const(&)[23]>
                ((String *)&local_408,(kj *)0x26506b,(char (*) [2])&local_398,
                 (StringPtr *)"\' cannot be evaluated.",(char (*) [23])&local_398);
    }
    else {
      kj::str<char_const(&)[2],kj::String&,char_const(&)[18]>
                ((String *)&local_408,(kj *)0x26506b,(char (*) [2])uVar16,
                 (String *)"\' is not defined.",(char (*) [18])params_2);
    }
  }
  else {
    if (*(short *)(in_stack_fffffffffffffc08 + 0xc) != 1) {
      if (*(short *)(in_stack_fffffffffffffc08 + 0xc) != 4) goto LAB_0019d8d6;
      constant = Schema::asConst(&local_3c0);
      DynamicValue::Reader::Reader((Reader *)&local_408,constant);
      DynamicValue::Reader::operator=(&local_330,(Reader *)&local_408);
      DynamicValue::Reader::~Reader((Reader *)&local_408);
      params = extraout_RDX;
LAB_0019da1b:
      local_3b8 = (SegmentReader *)((long)local_3b8 + (long)local_3b0 * 0x30);
      if ((SegmentReader *)uVar16 != local_3b8) {
        do {
          local_3a8 = (Arena *)0x2781dd;
          lVar12 = *(long *)&((SegmentReader *)uVar16)->id;
          if (lVar12 != 0) {
            local_3a8 = ((SegmentReader *)uVar16)->arena;
          }
          local_3a0 = lVar12 + (ulong)(lVar12 == 0);
          params_4 = SVar13.raw;
          if (!bVar17) {
            if (local_330.type != STRUCT) {
              kj::str<char_const(&)[2],kj::String&,char_const(&)[19]>
                        ((String *)&local_408,(kj *)0x26506b,
                         (char (*) [2])&((SegmentReader *)(uVar16 + -0x50))->readLimiter,
                         (String *)"\' is not a struct.",params_2);
              goto LAB_0019ddba;
            }
            DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                      (&local_2e8,&local_330);
            local_288.super_Schema.raw = local_2e8.schema.super_Schema.raw;
            name_00.content.size_ = local_3a0;
            name_00.content.ptr = (char *)local_3a8;
            params_4 = in_stack_fffffffffffffc00;
            StructSchema::findFieldByName
                      ((Maybe<capnp::StructSchema::Field> *)&local_408,&local_288,name_00);
            if (local_408.raw._0_1_ != VOID) {
              kj::
              str<char_const(&)[2],kj::String&,char_const(&)[18],kj::StringPtr&,char_const(&)[3]>
                        ((String *)&local_408,(kj *)0x26506b,
                         (char (*) [2])&((SegmentReader *)(uVar16 + -0x50))->readLimiter,
                         (String *)"\' has no member \'",(char (*) [18])&local_3a8,
                         (StringPtr *)0x25acdb,(char (*) [3])SVar13.raw);
              in_stack_fffffffffffffc00 = params_4;
              goto LAB_0019ddba;
            }
            local_398.reader._39_1_ = SUB81(in_stack_fffffffffffffc30,0);
            local_398.reader._40_7_ = SUB87((ulong)in_stack_fffffffffffffc30 >> 8,0);
            local_398.reader.ptr._7_1_ = (undefined1)in_stack_fffffffffffffc20;
            local_398.reader.elementCount =
                 (ListElementCount)((ulong)in_stack_fffffffffffffc20 >> 8);
            local_398.reader.step._0_3_ = (undefined3)((ulong)in_stack_fffffffffffffc20 >> 0x28);
            local_398.reader.step._3_1_ = (undefined1)in_stack_fffffffffffffc28;
            local_398.reader._32_7_ = SUB87((ulong)in_stack_fffffffffffffc28 >> 8,0);
            local_398.reader.segment._7_1_ = (undefined1)in_stack_fffffffffffffc10;
            local_398.reader.capTable._0_7_ = (undefined7)((ulong)in_stack_fffffffffffffc10 >> 8);
            local_398.reader.capTable._7_1_ = (undefined1)in_stack_fffffffffffffc18;
            local_398.reader.ptr._0_7_ =
                 (undefined7)(CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18) >> 8);
            local_398.schema.elementType._7_1_ = SUB81(params_4,0);
            local_398.schema.elementType.field_4.scopeId._0_7_ = (undefined7)((ulong)params_4 >> 8);
            local_398.schema.elementType.field_4.scopeId._7_1_ =
                 (undefined1)in_stack_fffffffffffffc08;
            local_398.reader.segment._0_7_ = (undefined7)((ulong)in_stack_fffffffffffffc08 >> 8);
            uStack_230 = CONCAT71(local_398.reader.ptr._0_7_,local_398.reader.capTable._7_1_);
            field._8_8_ = in_stack_fffffffffffffc08;
            field.parent.super_Schema.raw = (Schema)(Schema)params_4;
            field.proto._reader.segment = (SegmentReader *)in_stack_fffffffffffffc10;
            field.proto._reader.capTable = (CapTableReader *)uStack_230;
            field.proto._reader.data = (void *)in_stack_fffffffffffffc20;
            field.proto._reader.pointers = (WirePointer *)in_stack_fffffffffffffc28;
            field.proto._reader.dataSize = (int)in_stack_fffffffffffffc30;
            field.proto._reader.pointerCount = (short)((ulong)in_stack_fffffffffffffc30 >> 0x20);
            field.proto._reader._38_2_ = (short)((ulong)in_stack_fffffffffffffc30 >> 0x30);
            field.proto._reader._40_8_ = in_stack_fffffffffffffc38;
            in_stack_fffffffffffffc00 = params_4;
            DynamicStruct::Reader::get((Reader *)&local_408,&local_2e8,field);
            DynamicValue::Reader::operator=(&local_330,(Reader *)&local_408);
            DynamicValue::Reader::~Reader((Reader *)&local_408);
            params = extraout_RDX_01;
          }
          if (((SegmentReader *)uVar16)->readLimiter != (ReadLimiter *)0x0) {
            pRVar9 = (RawBrandedSchema *)0x0;
            pRVar15 = (RawBrandedSchema *)0x1;
            do {
              SVar13.raw = (RawBrandedSchema *)(((SegmentReader *)uVar16)->ptr).size_;
              if (local_330.type != LIST) {
                if ((int)pRVar15 != 1) {
                  local_2e8.schema.super_Schema.raw = (Schema)(Schema)SVar13.raw;
                  local_2e8.reader.segment = (SegmentReader *)pRVar9;
                  kj::strArray<kj::ArrayPtr<unsigned_long>>
                            ((String *)&local_398,(kj *)&local_2e8,(ArrayPtr<unsigned_long> *)"][",
                             (char *)SVar13.raw);
                  kj::
                  str<char_const(&)[2],kj::StringPtr&,char_const(&)[2],kj::String,char_const(&)[18]>
                            ((String *)&local_408,(kj *)0x26506b,(char (*) [2])&local_3a8,
                             (StringPtr *)0x254b3d,(char (*) [2])&local_398,
                             (String *)"]\' is not a list.",(char (*) [18])params_4);
                  (__return_storage_ptr__->errorMessage).ptr.isSet = true;
                  (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.ptr =
                       (char *)local_408.raw;
                  (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.size_ =
                       in_stack_fffffffffffffc00;
                  (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.disposer =
                       (ArrayDisposer *)in_stack_fffffffffffffc08;
                  local_408.raw = (RawBrandedSchema *)0x0;
                  lVar12 = CONCAT17(local_398.schema.elementType._7_1_,
                                    local_398.schema.elementType._0_7_);
                  if (lVar12 != 0) {
                    uVar16 = CONCAT17(local_398.schema.elementType.field_4.scopeId._7_1_,
                                      local_398.schema.elementType.field_4.scopeId._0_7_);
                    local_398.schema.elementType.baseType = VOID;
                    local_398.schema.elementType.listDepth = '\0';
                    local_398.schema.elementType.isImplicitParam = false;
                    local_398.schema.elementType.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
                    local_398.schema.elementType._6_1_ = 0;
                    local_398.schema.elementType._7_1_ = 0;
                    local_398.schema.elementType.field_4.scopeId._0_7_ = 0;
                    local_398.schema.elementType.field_4.scopeId._7_1_ = 0;
                    (*(code *)**(undefined8 **)
                                CONCAT17(local_398.reader.segment._7_1_,
                                         local_398.reader.segment._0_7_))
                              ((undefined8 *)
                               CONCAT17(local_398.reader.segment._7_1_,
                                        local_398.reader.segment._0_7_),lVar12,1,uVar16,uVar16,0);
                  }
                  goto LAB_0019ddd9;
                }
                kj::str<char_const(&)[2],kj::StringPtr&,char_const(&)[17]>
                          ((String *)&local_408,(kj *)0x26506b,(char (*) [2])&local_3a8,
                           (StringPtr *)0x254b55,(char (*) [17])params_2);
                goto LAB_0019ddba;
              }
              pRVar1 = (&(SVar13.raw)->generic)[(long)pRVar9];
              DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
                        (&local_398,&local_330);
              if ((RawSchema *)(ulong)local_398.reader.elementCount <= pRVar1) {
                local_288.super_Schema.raw = (Schema)(((SegmentReader *)uVar16)->ptr).size_;
                local_280 = pRVar15;
                kj::strArray<kj::ArrayPtr<unsigned_long>>
                          ((String *)&local_2e8,(kj *)&local_288,(ArrayPtr<unsigned_long> *)"][",
                           (char *)local_288.super_Schema.raw);
                kj::
                str<char_const(&)[2],kj::StringPtr&,char_const(&)[2],kj::String,char_const(&)[21]>
                          ((String *)&local_408,(kj *)0x26506b,(char (*) [2])&local_3a8,
                           (StringPtr *)0x254b3d,(char (*) [2])&local_2e8,
                           (String *)"]\' is out-of-bounds.",(char (*) [21])params_4);
                pSVar6 = local_2e8.reader.segment;
                SVar5.super_Schema.raw = (Schema)(Schema)local_2e8.schema;
                (__return_storage_ptr__->errorMessage).ptr.isSet = true;
                (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.ptr =
                     (char *)local_408.raw;
                (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.size_ =
                     in_stack_fffffffffffffc00;
                (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.disposer =
                     (ArrayDisposer *)in_stack_fffffffffffffc08;
                local_408.raw = (RawBrandedSchema *)0x0;
                if (local_2e8.schema.super_Schema.raw != (RawBrandedSchema *)0x0) {
                  local_2e8.schema.super_Schema.raw = (Schema)(RawBrandedSchema *)0x0;
                  local_2e8.reader.segment = (SegmentReader *)0x0;
                  (**(local_2e8.reader.capTable)->_vptr_CapTableReader)
                            (local_2e8.reader.capTable,SVar5.super_Schema.raw,1,pSVar6,pSVar6,0);
                }
                goto LAB_0019ddd9;
              }
              DynamicList::Reader::operator[]((Reader *)&local_408,&local_398,(uint)pRVar1);
              DynamicValue::Reader::operator=(&local_330,(Reader *)&local_408);
              DynamicValue::Reader::~Reader((Reader *)&local_408);
              bVar17 = pRVar15 < (RawBrandedSchema *)((SegmentReader *)uVar16)->readLimiter;
              pRVar9 = pRVar15;
              params = extraout_RDX_02;
              pRVar15 = (RawBrandedSchema *)(ulong)((int)pRVar15 + 1);
            } while (bVar17);
          }
          uVar16 = &((SegmentReader *)(uVar16 + 0x28))->id;
          bVar17 = false;
          SVar13.raw = (RawBrandedSchema *)params_4;
        } while ((SegmentReader *)uVar16 != local_3b8);
      }
      if (this->convertTo == TEXT) {
        if (this->pretty != true) goto LAB_0019e0f8;
        if (local_330.type != LIST) {
          if (local_330.type != STRUCT) goto LAB_0019e0f8;
          pPVar11 = this->context;
          DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                    (&local_200,&local_330);
          value_00.reader.segment = (SegmentReader *)in_stack_fffffffffffffc08;
          value_00.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffc00;
          value_00.reader.capTable = (CapTableReader *)in_stack_fffffffffffffc10;
          value_00.reader.data._0_4_ = in_stack_fffffffffffffc18;
          value_00.reader.data._4_4_ = in_stack_fffffffffffffc1c;
          value_00.reader.pointers = (WirePointer *)in_stack_fffffffffffffc20;
          value_00.reader.dataSize = (int)in_stack_fffffffffffffc28;
          value_00.reader.pointerCount = (short)((ulong)in_stack_fffffffffffffc28 >> 0x20);
          value_00.reader._38_2_ = (short)((ulong)in_stack_fffffffffffffc28 >> 0x30);
          value_00.reader._40_8_ = in_stack_fffffffffffffc30;
          prettyPrint(value_00);
          kj::StringTree::flatten((String *)&local_398,(StringTree *)&local_408);
          lVar12 = CONCAT17(local_398.schema.elementType.field_4.scopeId._7_1_,
                            local_398.schema.elementType.field_4.scopeId._0_7_);
          if (lVar12 == 0) goto LAB_0019e1c7;
          pcVar14 = (char *)CONCAT17(local_398.schema.elementType._7_1_,
                                     local_398.schema.elementType._0_7_);
          goto LAB_0019e1ce;
        }
        pPVar11 = this->context;
        DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
                  (&local_1c8,&local_330);
        value_01.schema.elementType.field_4.schema = (RawBrandedSchema *)in_stack_fffffffffffffc08;
        value_01.schema.elementType.baseType = (short)in_stack_fffffffffffffc00;
        value_01.schema.elementType.listDepth = (char)((ulong)in_stack_fffffffffffffc00 >> 0x10);
        value_01.schema.elementType.isImplicitParam =
             (bool)(char)((ulong)in_stack_fffffffffffffc00 >> 0x18);
        value_01.schema.elementType.field_3 =
             (anon_union_2_2_d12d5221_for_Type_3)(short)((ulong)in_stack_fffffffffffffc00 >> 0x20);
        value_01.schema.elementType._6_2_ = (short)((ulong)in_stack_fffffffffffffc00 >> 0x30);
        value_01.reader.segment = (SegmentReader *)in_stack_fffffffffffffc10;
        value_01.reader.capTable._0_4_ = in_stack_fffffffffffffc18;
        value_01.reader.capTable._4_4_ = in_stack_fffffffffffffc1c;
        value_01.reader.ptr = (byte *)in_stack_fffffffffffffc20;
        value_01.reader.elementCount = (int)in_stack_fffffffffffffc28;
        value_01.reader.step = (int)((ulong)in_stack_fffffffffffffc28 >> 0x20);
        value_01.reader.structDataSize = (int)in_stack_fffffffffffffc30;
        value_01.reader.structPointerCount = (short)((ulong)in_stack_fffffffffffffc30 >> 0x20);
        value_01.reader.elementSize = (char)((ulong)in_stack_fffffffffffffc30 >> 0x30);
        value_01.reader._39_1_ = (char)((ulong)in_stack_fffffffffffffc30 >> 0x38);
        value_01.reader._40_8_ = in_stack_fffffffffffffc38;
        prettyPrint(value_01);
        kj::StringTree::flatten((String *)&local_398,(StringTree *)&local_408);
        lVar12 = CONCAT17(local_398.schema.elementType.field_4.scopeId._7_1_,
                          local_398.schema.elementType.field_4.scopeId._0_7_);
        if (lVar12 != 0) {
          pcVar14 = (char *)CONCAT17(local_398.schema.elementType._7_1_,
                                     local_398.schema.elementType._0_7_);
          goto LAB_0019e1e6;
        }
      }
      else {
        if (local_330.type != STRUCT) {
          kj::heapString((String *)&local_408,
                         "not a struct; binary output is only available on structs",0x38);
          goto LAB_0019ddba;
        }
        DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                  ((ReaderFor<DynamicStruct> *)&local_408,&local_330);
        (this->rootType).super_Schema.raw = local_408.raw;
        kj::FdOutputStream::FdOutputStream((FdOutputStream *)&local_398,1);
        reader._reader.pointers._4_4_ = in_stack_fffffffffffffc1c;
        reader._reader.pointers._0_4_ = in_stack_fffffffffffffc18;
        reader._reader.capTable = (CapTableReader *)in_stack_fffffffffffffc08;
        reader._reader.segment = (SegmentReader *)in_stack_fffffffffffffc00;
        reader._reader.data = (void *)in_stack_fffffffffffffc10;
        reader._reader._32_8_ = in_stack_fffffffffffffc20;
        reader._reader._40_8_ = in_stack_fffffffffffffc28;
        writeConversion(this,reader,(OutputStream *)&local_398);
        (*this->context->_vptr_ProcessContext[1])();
        params = extraout_RDX_03;
LAB_0019e0f8:
        pPVar11 = this->context;
        kj::str<capnp::DynamicValue::Reader&>((String *)&local_408,(kj *)&local_330,params);
        SVar13.raw = local_408.raw;
        if ((CapTableReader *)in_stack_fffffffffffffc00 == (CapTableReader *)0x0) {
          SVar13.raw = (RawBrandedSchema *)0x2781dd;
        }
        (*pPVar11->_vptr_ProcessContext[5])
                  (pPVar11,SVar13.raw,
                   (char *)(in_stack_fffffffffffffc00 +
                           (ulong)((CapTableReader *)in_stack_fffffffffffffc00 ==
                                  (CapTableReader *)0x0)));
        lVar12 = extraout_RDX_04;
LAB_0019e1c7:
        pcVar14 = "";
LAB_0019e1ce:
        (*pPVar11->_vptr_ProcessContext[5])(pPVar11,pcVar14,lVar12 + (ulong)(lVar12 == 0));
        lVar12 = extraout_RDX_05;
      }
      pcVar14 = "";
LAB_0019e1e6:
      iVar8 = (*pPVar11->_vptr_ProcessContext[5])(pPVar11,pcVar14,lVar12 + (ulong)(lVar12 == 0));
      kj::String::~String((String *)&local_398);
      kj::StringTree::~StringTree((StringTree *)&local_408);
      SegmentArrayMessageReader::~SegmentArrayMessageReader(&local_178);
      DynamicValue::Reader::~Reader(&local_330);
      kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::~Array(&local_348);
      if (local_2a8.parent != (IteratorInput<char,_const_char_*> *)0x0) {
        pcVar14 = local_2a8.best;
        if (local_2a8.best < local_2a8.pos) {
          pcVar14 = local_2a8.pos;
        }
        if (pcVar14 <= (local_2a8.parent)->best) {
          pcVar14 = (local_2a8.parent)->best;
        }
        (local_2a8.parent)->best = pcVar14;
      }
      _Unwind_Resume(iVar8);
    }
    if ((SegmentReader *)uVar16 != (SegmentReader *)((long)local_3b0 * 0x30 + (long)local_3b8)) {
      Schema::asStruct(&local_3c0);
      MessageReader::getRootInternal((Reader *)&local_2e8,&local_178.super_MessageReader);
      reader_00.capTable = (CapTableReader *)in_stack_fffffffffffffc08;
      reader_00.segment = (SegmentReader *)in_stack_fffffffffffffc00;
      reader_00.pointer = (WirePointer *)in_stack_fffffffffffffc10;
      reader_00.nestingLimit = in_stack_fffffffffffffc18;
      reader_00._28_4_ = in_stack_fffffffffffffc1c;
      SVar13 = local_2e8.schema.super_Schema.raw;
      capnp::_::PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
                (reader_00,(StructSchema)local_2e8.reader.segment);
      local_408.raw._0_4_ = 10;
      in_stack_fffffffffffffc00 =
           CONCAT17(local_398.schema.elementType._7_1_,local_398.schema.elementType._0_7_);
      in_stack_fffffffffffffc08 =
           CONCAT17(local_398.schema.elementType.field_4.scopeId._7_1_,
                    local_398.schema.elementType.field_4.scopeId._0_7_);
      in_stack_fffffffffffffc10._7_1_ = local_398.reader.segment._7_1_;
      in_stack_fffffffffffffc10._0_7_ = local_398.reader.segment._0_7_;
      in_stack_fffffffffffffc20 = CONCAT17(local_398.reader.ptr._7_1_,local_398.reader.ptr._0_7_);
      in_stack_fffffffffffffc28 = CONCAT44(local_398.reader.step,local_398.reader.elementCount);
      in_stack_fffffffffffffc18 = (undefined4)local_398.reader.capTable._0_7_;
      in_stack_fffffffffffffc1c =
           (undefined4)
           (CONCAT17(local_398.reader.capTable._7_1_,local_398.reader.capTable._0_7_) >> 0x20);
      in_stack_fffffffffffffc30 = CONCAT17(local_398.reader._39_1_,local_398.reader._32_7_);
      DynamicValue::Reader::operator=(&local_330,(Reader *)&local_408);
      DynamicValue::Reader::~Reader((Reader *)&local_408);
      params = extraout_RDX_00;
      goto LAB_0019da1b;
    }
    SVar18 = Schema::getShortDisplayName(&local_3c0);
    local_398.schema.elementType._0_7_ = SVar18.content.ptr._0_7_;
    local_398.schema.elementType._7_1_ = SVar18.content.ptr._7_1_;
    local_398.schema.elementType.field_4.scopeId._0_7_ = SVar18.content.size_._0_7_;
    local_398.schema.elementType.field_4.scopeId._7_1_ = SVar18.content.size_._7_1_;
    kj::str<char_const(&)[2],kj::StringPtr,char_const(&)[23]>
              ((String *)&local_408,(kj *)0x26506b,(char (*) [2])&local_398,
               (StringPtr *)"\' cannot be evaluated.",(char (*) [23])&local_398);
  }
LAB_0019ddba:
  (__return_storage_ptr__->errorMessage).ptr.isSet = true;
  (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.ptr = (char *)local_408.raw;
  (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.size_ = in_stack_fffffffffffffc00
  ;
  (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.disposer =
       (ArrayDisposer *)in_stack_fffffffffffffc08;
LAB_0019ddd9:
  SegmentArrayMessageReader::~SegmentArrayMessageReader(&local_178);
  DynamicValue::Reader::~Reader(&local_330);
  sVar4 = local_348.size_;
  pTVar3 = local_348.ptr;
  if ((SegmentReader *)local_348.ptr != (SegmentReader *)0x0) {
    local_348.ptr = (Tuple<kj::String,_kj::Array<unsigned_long>_> *)0x0;
    local_348.size_ = 0;
    (*(code *)((Arena *)(local_348.disposer)->_vptr_ArrayDisposer)->_vptr_Arena)
              (local_348.disposer,pTVar3,0x30,sVar4,sVar4,
               kj::ArrayDisposer::
               Dispose_<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>,_false>::destruct);
  }
LAB_0019de2f:
  if (local_2a8.parent != (IteratorInput<char,_const_char_*> *)0x0) {
    if (local_2a8.best < local_2a8.pos) {
      local_2a8.best = local_2a8.pos;
    }
    if (local_2a8.best <= (local_2a8.parent)->best) {
      local_2a8.best = (local_2a8.parent)->best;
    }
    (local_2a8.parent)->best = local_2a8.best;
  }
  return __return_storage_ptr__;
}

Assistant:

kj::MainBuilder::Validity evalConst(kj::StringPtr name) {
    convertTo = formatFromDeprecatedFlags(convertTo);

    KJ_ASSERT(sourceFiles.size() == 1);

    auto parser = kj::parse::sequence(
        kj::parse::many(
            kj::parse::sequence(
                kj::parse::identifier,
                kj::parse::many(
                    kj::parse::sequence(
                        kj::parse::exactChar<'['>(),
                        kj::parse::integer,
                        kj::parse::exactChar<']'>())),
                kj::parse::oneOf(
                    kj::parse::endOfInput,
                    kj::parse::sequence(
                        kj::parse::exactChar<'.'>(),
                        kj::parse::notLookingAt(kj::parse::endOfInput))))),
        kj::parse::endOfInput);

    kj::parse::IteratorInput<char, const char*> input(name.begin(), name.end());

    kj::Array<kj::Tuple<kj::String, kj::Array<uint64_t>>> nameParts;
    KJ_IF_MAYBE(p, parser(input)) {
      nameParts = kj::mv(*p);
    } else {
      return "invalid syntax";
    }